

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O1

sat_solver * Pdr_ManCreateSolver(Pdr_Man_t *p,int k)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Vec_t *pVVar3;
  sat_solver *psVar4;
  void **ppvVar5;
  undefined8 *puVar6;
  Aig_Man_t *pAVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  if (p->vSolvers->nSize != k) {
    __assert_fail("Vec_PtrSize(p->vSolvers) == k",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                  ,0x32,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
  }
  if (p->vClauses->nSize != k) {
    __assert_fail("Vec_VecSize(p->vClauses) == k",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                  ,0x33,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
  }
  if (p->vActVars->nSize != k) {
    __assert_fail("Vec_IntSize(p->vActVars) == k",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                  ,0x34,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
  }
  psVar4 = sat_solver_new();
  psVar4 = Pdr_ManNewSolver(psVar4,p,k,(uint)(k == 0));
  pVVar2 = p->vSolvers;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar5;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar1 * 2;
      if (iVar8 <= (int)uVar1) goto LAB_0056fe18;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar5;
    }
    pVVar2->nCap = iVar8;
  }
LAB_0056fe18:
  iVar8 = pVVar2->nSize;
  pVVar2->nSize = iVar8 + 1;
  pVVar2->pArray[iVar8] = psVar4;
  pVVar3 = p->vClauses;
  if (pVVar3->nSize <= k) {
    iVar8 = k + 1;
    if (pVVar3->nCap <= k) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((long)iVar8 << 3);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(long)iVar8 << 3);
      }
      pVVar3->pArray = ppvVar5;
      pVVar3->nCap = iVar8;
    }
    iVar10 = pVVar3->nSize;
    lVar9 = (long)iVar10;
    if (iVar10 <= k) {
      iVar10 = (k - iVar10) + 1;
      do {
        puVar6 = (undefined8 *)malloc(0x10);
        *puVar6 = 0;
        puVar6[1] = 0;
        pVVar3->pArray[lVar9] = puVar6;
        lVar9 = lVar9 + 1;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    pVVar3->nSize = iVar8;
  }
  Vec_IntPush(p->vActVars,0);
  pAVar7 = p->pAig;
  if (0 < pAVar7->nTruePos) {
    lVar9 = 0;
    do {
      if (pAVar7->vCos->nSize <= lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Pdr_ObjSatVar(p,k,1,(Aig_Obj_t *)pAVar7->vCos->pArray[lVar9]);
      lVar9 = lVar9 + 1;
      pAVar7 = p->pAig;
    } while (lVar9 < pAVar7->nTruePos);
  }
  return psVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates new SAT solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
sat_solver * Pdr_ManCreateSolver( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int i;
    assert( Vec_PtrSize(p->vSolvers) == k );
    assert( Vec_VecSize(p->vClauses) == k );
    assert( Vec_IntSize(p->vActVars) == k );
    // create new solver
    pSat = sat_solver_new();
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    Vec_PtrPush( p->vSolvers, pSat );
    Vec_VecExpand( p->vClauses, k );
    Vec_IntPush( p->vActVars, 0 );
    // add property cone
    Saig_ManForEachPo( p->pAig, pObj, i )
        Pdr_ObjSatVar( p, k, 1, pObj );
    return pSat;
}